

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O1

void CNetBan::ConUnban(IResult *pResult,void *pUser)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  long lVar3;
  long *plVar4;
  long in_FS_OFFSET;
  CNetRange Range;
  char aBuf [256];
  CNetRange CStack_158;
  char local_128 [264];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*pResult->_vptr_IResult[4])(pResult,0);
  str_copy(local_128,(char *)CONCAT44(extraout_var,iVar1),0x100);
  pcVar2 = str_find(local_128,"-");
  iVar1 = str_is_number(local_128);
  if (iVar1 == 0) {
    iVar1 = str_toint(local_128);
    UnbanByIndex((CNetBan *)pUser,iVar1);
  }
  else {
    if ((pcVar2 == (char *)0x0) || (pcVar2[1] == '\0')) {
      iVar1 = net_addr_from_str((NETADDR *)&CStack_158,local_128);
      if (iVar1 == 0) {
        Unban<CNetBan::CBanPool<NETADDR,1>>
                  ((CNetBan *)pUser,(CBanPool<NETADDR,_1> *)((long)pUser + 0x18),&CStack_158.m_LB);
        goto LAB_001c6191;
      }
      plVar4 = *(long **)((long)pUser + 8);
      lVar3 = *plVar4;
      pcVar2 = "unban error (invalid network address)";
    }
    else {
      *pcVar2 = '\0';
      iVar1 = net_addr_from_str((NETADDR *)&CStack_158,local_128);
      if (iVar1 == 0) {
        iVar1 = net_addr_from_str((NETADDR *)&CStack_158.m_UB,pcVar2 + 1);
        if (iVar1 == 0) {
          UnbanByRange((CNetBan *)pUser,&CStack_158);
          goto LAB_001c6191;
        }
      }
      plVar4 = *(long **)((long)pUser + 8);
      lVar3 = *plVar4;
      pcVar2 = "unban error (invalid range)";
    }
    (**(code **)(lVar3 + 200))(plVar4,0,"net_ban",pcVar2,0);
  }
LAB_001c6191:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBan::ConUnban(IConsole::IResult *pResult, void *pUser)
{
	CNetBan *pThis = static_cast<CNetBan *>(pUser);

	char aBuf[256];
	str_copy(aBuf, pResult->GetString(0), sizeof(aBuf));
	const char *pSeparator = str_find(aBuf, "-");

	if(!str_is_number(aBuf))
	{
		pThis->UnbanByIndex(str_toint(aBuf));
	}
	else if(pSeparator == NULL || pSeparator[1] == '\0')
	{
		NETADDR Addr;
		if(net_addr_from_str(&Addr, aBuf) == 0)
			pThis->UnbanByAddr(&Addr);
		else
			pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "unban error (invalid network address)");
	}
	else
	{
		aBuf[pSeparator-&aBuf[0]] = '\0';

		CNetRange Range;
		if(net_addr_from_str(&Range.m_LB, aBuf) == 0 && net_addr_from_str(&Range.m_UB, pSeparator+1) == 0)
			pThis->UnbanByRange(&Range);
		else
			pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "unban error (invalid range)");
	}
}